

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O2

void lin_reg<float,float>
               (vector<float,_std::allocator<float>_> *x,vector<float,_std::allocator<float>_> *y,
               double *coeff,double *intercept,size_t start,size_t end)

{
  pointer pfVar1;
  uint __line;
  long lVar2;
  char *__assertion;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  
  lVar2 = (long)(y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
  pfVar1 = (x->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (lVar2 == (long)(x->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pfVar1) {
    if (end <= (ulong)(lVar2 >> 2)) {
      lVar2 = end - start;
      auVar7._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar7._0_8_ = lVar2;
      auVar7._12_4_ = 0x45300000;
      dVar8 = (auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
      dVar3 = std::
              inner_product<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,double>
                        ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                         (pfVar1 + start),
                         (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                         (pfVar1 + end),
                         (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                         (pfVar1 + start),0.0);
      pfVar1 = (x->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar4 = std::
              accumulate<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,double>
                        ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                         (pfVar1 + start),
                         (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                         (pfVar1 + end),0.0);
      dVar9 = dVar8 * dVar3 - dVar4 * dVar4;
      pfVar1 = (y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar5 = std::
              accumulate<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,double>
                        ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                         (pfVar1 + start),
                         (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                         (pfVar1 + end),0.0);
      pfVar1 = (x->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar6 = std::
              inner_product<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,double>
                        ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                         (pfVar1 + start),
                         (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                         (pfVar1 + end),
                         (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                         ((y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start + start),0.0);
      *intercept = (dVar3 / dVar9) * dVar5 + (-dVar4 / dVar9) * dVar6;
      *coeff = (-dVar4 / dVar9) * dVar5 + (dVar8 / dVar9) * dVar6;
      return;
    }
    __assertion = "start >= 0 && end <= x.size()";
    __line = 0x2d;
  }
  else {
    __assertion = "y.size() == x.size()";
    __line = 0x2c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/vrunge[P]slopeOP/src/linalg.h"
                ,__line,
                "void lin_reg(vector<T1> &, vector<T2> &, double *, double *, size_t, size_t) [T1 = float, T2 = float]"
               );
}

Assistant:

void lin_reg(vector<T1> &x, vector<T2> &y, double *coeff, double *intercept,
             size_t start, size_t end) {
  /* calculate LSLR on x,y from position start to end (excluded). */

  assert(y.size() == x.size());
  assert(start >= 0 && end <= x.size());

  double m00, m11, m01, det;
  double i00, i11, i01;

  m00 = end - start;
  m11 =
      inner_product(x.begin() + start, x.begin() + end, x.begin() + start, 0.0);
  m01 = accumulate(x.begin() + start, x.begin() + end, 0.0);

  det = (m00 * m11) - m01 * m01;

  i00 = m11 / det;
  i11 = m00 / det;
  i01 = -m01 / det;

  double v1 = accumulate(y.begin() + start, y.begin() + end, 0.0);
  double v2 =
      inner_product(x.begin() + start, x.begin() + end, y.begin() + start, 0.0);

  *intercept = i00 * v1 + i01 * v2;
  *coeff = i01 * v1 + i11 * v2;
}